

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O2

int Amap_LibCreateNode(Amap_Lib_t *p,int iFan0,int iFan1,int fXor)

{
  byte bVar1;
  Amap_Nod_t *pAVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Amap_Nod_t *pAVar9;
  Vec_Int_t *pVVar10;
  uint Lit;
  Vec_Ptr_t **ppVVar11;
  uint Lit_00;
  
  Lit_00 = iFan1;
  if (iFan0 < iFan1) {
    Lit_00 = iFan0;
  }
  Lit = iFan1;
  if (iFan1 < iFan0) {
    Lit = iFan0;
  }
  pAVar9 = Amap_LibCreateObj(p);
  pAVar9->field_0x3 = fXor == 0 ^ 5;
  pAVar2 = p->pNodes;
  uVar4 = Abc_Lit2Var(Lit);
  bVar1 = pAVar2[uVar4].field_0x2;
  pAVar2 = p->pNodes;
  uVar5 = Abc_Lit2Var(Lit_00);
  uVar4 = *(uint *)pAVar9;
  pAVar9->field_0x2 = (char)((uint)bVar1 * 0x10000 + *(int *)(pAVar2 + uVar5) >> 0x10);
  pAVar9->iFan0 = (short)Lit;
  pAVar9->iFan1 = (short)Lit_00;
  if (p->fVerbose != 0) {
    uVar3 = 0x78;
    if (fXor == 0) {
      uVar3 = 0x20;
    }
    uVar5 = Abc_Lit2Var(Lit);
    iVar6 = Abc_LitIsCompl(Lit);
    uVar7 = Abc_Lit2Var(Lit_00);
    iVar8 = Abc_LitIsCompl(Lit_00);
    printf("Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n",(ulong)(uVar4 & 0xffff),uVar3,
           (ulong)uVar5,(ulong)(iVar6 * 2 + 0x2b),(ulong)uVar7,iVar8 * 2 + 0x2b);
  }
  if (fXor == 0) {
    pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRules,Lit);
    Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | Lit_00);
    if (iFan1 == iFan0) goto LAB_0038170f;
    ppVVar11 = &p->vRules;
  }
  else {
    pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRulesX,Lit);
    Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | Lit_00);
    if (iFan1 == iFan0) goto LAB_0038170f;
    ppVVar11 = &p->vRulesX;
  }
  pVVar10 = (Vec_Int_t *)Vec_PtrEntry(*ppVVar11,Lit_00);
  Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | Lit);
LAB_0038170f:
  return (int)*(ushort *)pAVar9;
}

Assistant:

int Amap_LibCreateNode( Amap_Lib_t * p, int iFan0, int iFan1, int fXor )
{
    Amap_Nod_t * pNode;
    int iFan;
    if ( iFan0 < iFan1 )
    {
        iFan  = iFan0;
        iFan0 = iFan1;
        iFan1 = iFan;
    }
    pNode = Amap_LibCreateObj( p );
    pNode->Type  = fXor? AMAP_OBJ_XOR : AMAP_OBJ_AND;
    pNode->nSuppSize = p->pNodes[Abc_Lit2Var(iFan0)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan1)].nSuppSize;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
if ( p->fVerbose )
printf( "Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n", 
pNode->Id, (fXor?'x':' '), 
Abc_Lit2Var(iFan0), (Abc_LitIsCompl(iFan0)?'-':'+'), 
Abc_Lit2Var(iFan1), (Abc_LitIsCompl(iFan1)?'-':'+') );

    if ( fXor )
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    else
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    return pNode->Id;
}